

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_trainer.cc
# Opt level: O1

SentencePieceNormalizer * __thiscall
sentencepiece::SentencePieceNormalizer::Load(SentencePieceNormalizer *this,string_view filename)

{
  ModelProto *this_00;
  Status *_status;
  __single_object model_proto;
  _Head_base<0UL,_sentencepiece::ModelProto_*,_false> local_38;
  __uniq_ptr_impl<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>
  local_30;
  
  this_00 = (ModelProto *)operator_new(0x68);
  sentencepiece::ModelProto::ModelProto(this_00,(Arena *)0x0);
  local_38._M_head_impl = this_00;
  sentencepiece::io::LoadModelProto(this,filename._M_str);
  if (this->_vptr_SentencePieceNormalizer == (_func_int **)0x0) {
    sentencepiece::util::Status::~Status((Status *)this);
    local_30._M_t.
    super__Tuple_impl<0UL,_sentencepiece::ModelProto_*,_std::default_delete<sentencepiece::ModelProto>_>
    .super__Head_base<0UL,_sentencepiece::ModelProto_*,_false>._M_head_impl =
         (tuple<sentencepiece::ModelProto_*,_std::default_delete<sentencepiece::ModelProto>_>)
         (tuple<sentencepiece::ModelProto_*,_std::default_delete<sentencepiece::ModelProto>_>)
         local_38._M_head_impl;
    local_38._M_head_impl = (ModelProto *)0x0;
    (**(code **)(*(long *)filename._M_len + 0x10))(this,(long *)filename._M_len);
    std::unique_ptr<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>::
    ~unique_ptr((unique_ptr<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>
                 *)&local_30);
  }
  std::unique_ptr<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>::
  ~unique_ptr((unique_ptr<sentencepiece::ModelProto,_std::default_delete<sentencepiece::ModelProto>_>
               *)&local_38);
  return this;
}

Assistant:

util::Status SentencePieceNormalizer::Load(absl::string_view filename) {
  auto model_proto = std::make_unique<ModelProto>();
  RETURN_IF_ERROR(io::LoadModelProto(filename, model_proto.get()));
  return Load(std::move(model_proto));
}